

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::Marray<unsigned_long*>
          (Marray<float,std::allocator<unsigned_long>> *this,unsigned_long *begin,unsigned_long *end
          ,float *value,CoordinateOrder *coordinateOrder,allocator_type *allocator)

{
  long lVar1;
  unsigned_long *puVar2;
  float *data;
  size_type sVar3;
  size_type __n;
  allocator_type local_39;
  allocator_type *local_38;
  
  local_38 = allocator;
  View<float,_false,_std::allocator<unsigned_long>_>::View
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this,&local_39);
  __n = 1;
  for (puVar2 = begin; puVar2 != end; puVar2 = puVar2 + 1) {
    __n = __n * *puVar2;
  }
  marray_detail::Assert<bool>(__n != 0);
  data = __gnu_cxx::new_allocator<float>::allocate
                   ((new_allocator<float> *)(this + 0x40),__n,(void *)0x0);
  View<float,false,std::allocator<unsigned_long>>::assign<unsigned_long*>
            ((View<float,false,std::allocator<unsigned_long>> *)this,begin,end,data,coordinateOrder,
             coordinateOrder,local_38);
  lVar1 = *(long *)this;
  for (sVar3 = 0; __n != sVar3; sVar3 = sVar3 + 1) {
    *(float *)(lVar1 + sVar3 * 4) = *value;
  }
  Marray<float,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<float,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
)
: dataAllocator_(allocator)
{
    std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
        std::multiplies<std::size_t>());
    marray_detail::Assert(MARRAY_NO_ARG_TEST || size != 0);
    base::assign(begin, end, dataAllocator_.allocate(size), coordinateOrder, 
        coordinateOrder, allocator); 
    for(std::size_t j=0; j<size; ++j) {
        this->data_[j] = value;
    }
    testInvariant();
}